

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O2

void png_write_pCAL(png_structrp png_ptr,png_charp purpose,png_int_32 X0,png_int_32 X1,int type,
                   int nparams,png_const_charp units,png_charpp params)

{
  png_uint_32 pVar1;
  size_t sVar2;
  png_voidp ptr;
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  char *error_message;
  ulong uVar6;
  long lVar7;
  png_byte buf [10];
  png_byte new_purpose [80];
  
  if (type < 4) {
    pVar1 = png_check_keyword(png_ptr,purpose,new_purpose);
    if (pVar1 != 0) {
      sVar2 = strlen(units);
      lVar7 = sVar2 + (pVar1 + 1) + (ulong)(nparams != 0) + 10;
      ptr = png_malloc(png_ptr,(long)nparams * 8);
      uVar6 = 0;
      uVar5 = 0;
      if (0 < nparams) {
        uVar5 = (ulong)(uint)nparams;
      }
      for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
        sVar3 = strlen(params[uVar6]);
        lVar4 = (nparams - 1 != uVar6) + sVar3;
        *(long *)((long)ptr + uVar6 * 8) = lVar4;
        lVar7 = lVar7 + lVar4;
      }
      png_write_chunk_header(png_ptr,0x7043414c,(png_uint_32)lVar7);
      png_write_chunk_data(png_ptr,new_purpose,(ulong)(pVar1 + 1));
      png_save_int_32(buf,X0);
      png_save_int_32(buf + 4,X1);
      buf[8] = (png_byte)type;
      buf[9] = (png_byte)nparams;
      png_write_chunk_data(png_ptr,buf,10);
      png_write_chunk_data(png_ptr,(png_const_bytep)units,sVar2 + (nparams != 0));
      for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
        png_write_chunk_data
                  (png_ptr,(png_const_bytep)params[uVar6],*(size_t *)((long)ptr + uVar6 * 8));
      }
      png_free(png_ptr,ptr);
      png_write_chunk_end(png_ptr);
      return;
    }
    error_message = "pCAL: invalid keyword";
  }
  else {
    error_message = "Unrecognized equation type for pCAL chunk";
  }
  png_error(png_ptr,error_message);
}

Assistant:

void /* PRIVATE */
png_write_pCAL(png_structrp png_ptr, png_charp purpose, png_int_32 X0,
    png_int_32 X1, int type, int nparams, png_const_charp units,
    png_charpp params)
{
   png_uint_32 purpose_len;
   size_t units_len, total_len;
   size_t *params_len;
   png_byte buf[10];
   png_byte new_purpose[80];
   int i;

   png_debug1(1, "in png_write_pCAL (%d parameters)", nparams);

   if (type >= PNG_EQUATION_LAST)
      png_error(png_ptr, "Unrecognized equation type for pCAL chunk");

   purpose_len = png_check_keyword(png_ptr, purpose, new_purpose);

   if (purpose_len == 0)
      png_error(png_ptr, "pCAL: invalid keyword");

   ++purpose_len; /* terminator */

   png_debug1(3, "pCAL purpose length = %d", (int)purpose_len);
   units_len = strlen(units) + (nparams == 0 ? 0 : 1);
   png_debug1(3, "pCAL units length = %d", (int)units_len);
   total_len = purpose_len + units_len + 10;

   params_len = (size_t *)png_malloc(png_ptr,
       (png_alloc_size_t)((png_alloc_size_t)nparams * (sizeof (size_t))));

   /* Find the length of each parameter, making sure we don't count the
    * null terminator for the last parameter.
    */
   for (i = 0; i < nparams; i++)
   {
      params_len[i] = strlen(params[i]) + (i == nparams - 1 ? 0 : 1);
      png_debug2(3, "pCAL parameter %d length = %lu", i,
          (unsigned long)params_len[i]);
      total_len += params_len[i];
   }

   png_debug1(3, "pCAL total length = %d", (int)total_len);
   png_write_chunk_header(png_ptr, png_pCAL, (png_uint_32)total_len);
   png_write_chunk_data(png_ptr, new_purpose, purpose_len);
   png_save_int_32(buf, X0);
   png_save_int_32(buf + 4, X1);
   buf[8] = (png_byte)type;
   buf[9] = (png_byte)nparams;
   png_write_chunk_data(png_ptr, buf, 10);
   png_write_chunk_data(png_ptr, (png_const_bytep)units, (size_t)units_len);

   for (i = 0; i < nparams; i++)
   {
      png_write_chunk_data(png_ptr, (png_const_bytep)params[i], params_len[i]);
   }

   png_free(png_ptr, params_len);
   png_write_chunk_end(png_ptr);
}